

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_SequenceNumberRecovery::_Run(_Test_SequenceNumberRecovery *this)

{
  string v;
  Status local_200;
  Status local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e1;
  char *local_1e0;
  undefined8 uStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  Tester local_1b0;
  
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x10f);
  local_200.state_._0_1_ = 0;
  local_1d0._M_dataplus._M_p = "foo";
  local_1d0._M_string_length = 3;
  local_1e0 = "v1";
  uStack_1d8 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_1f8);
  test::Tester::IsOk(&local_1b0,&local_1f8);
  Status::~Status(&local_1f8);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x110);
  local_200.state_._0_1_ = 0;
  local_1d0._M_dataplus._M_p = "foo";
  local_1d0._M_string_length = 3;
  local_1e0 = "v2";
  uStack_1d8 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_1f8);
  test::Tester::IsOk(&local_1b0,&local_1f8);
  Status::~Status(&local_1f8);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x111);
  local_200.state_._0_1_ = 0;
  local_1d0._M_dataplus._M_p = "foo";
  local_1d0._M_string_length = 3;
  local_1e0 = "v3";
  uStack_1d8 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_1f8);
  test::Tester::IsOk(&local_1b0,&local_1f8);
  Status::~Status(&local_1f8);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x112);
  local_200.state_._0_1_ = 0;
  local_1d0._M_dataplus._M_p = "foo";
  local_1d0._M_string_length = 3;
  local_1e0 = "v4";
  uStack_1d8 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_1f8);
  test::Tester::IsOk(&local_1b0,&local_1f8);
  Status::~Status(&local_1f8);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x113);
  local_200.state_._0_1_ = 0;
  local_1d0._M_dataplus._M_p = "foo";
  local_1d0._M_string_length = 3;
  local_1e0 = "v5";
  uStack_1d8 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_1f8);
  test::Tester::IsOk(&local_1b0,&local_1f8);
  Status::~Status(&local_1f8);
  test::Tester::~Tester(&local_1b0);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x117);
  uStack_1d8 = 0;
  local_1e0 = (char *)0x100;
  local_1f8.state_ = "foo";
  local_1f0 = 3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_200);
  test::Tester::IsOk(&local_1b0,&local_200);
  Status::~Status(&local_200);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x118);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1b0,(char (*) [3])"v5",&local_1d0);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11b);
  local_1e1 = 0;
  local_1e0 = "foo";
  uStack_1d8 = 3;
  local_1f8.state_ = "v6";
  local_1f0 = 2;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_200);
  test::Tester::IsOk(&local_1b0,&local_200);
  Status::~Status(&local_200);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11c);
  uStack_1d8 = 0;
  local_1e0 = (char *)0x100;
  local_1f8.state_ = "foo";
  local_1f0 = 3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_200);
  test::Tester::IsOk(&local_1b0,&local_200);
  Status::~Status(&local_200);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11d);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1b0,(char (*) [3])"v6",&local_1d0);
  test::Tester::~Tester(&local_1b0);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x11f);
  uStack_1d8 = 0;
  local_1e0 = (char *)0x100;
  local_1f8.state_ = "foo";
  local_1f0 = 3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_200);
  test::Tester::IsOk(&local_1b0,&local_200);
  Status::~Status(&local_200);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x120);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1b0,(char (*) [3])"v6",&local_1d0);
  test::Tester::~Tester(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  return;
}

Assistant:

TEST(CorruptionTest, SequenceNumberRecovery) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v1"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v2"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v3"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v4"));
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v5"));
  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v5", v);
  // Write something.  If sequence number was not recovered properly,
  // it will be hidden by an earlier write.
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "v6"));
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
  Reopen();
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("v6", v);
}